

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void partition_gather_vert_alike(aom_cdf_prob *out,aom_cdf_prob *in,BLOCK_SIZE bsize)

{
  aom_cdf_prob aVar1;
  char in_DL;
  aom_cdf_prob *in_RSI;
  short *in_RDI;
  
  *in_RDI = -0x8000;
  aVar1 = cdf_element_prob(in_RSI,2);
  *in_RDI = *in_RDI - aVar1;
  aVar1 = cdf_element_prob(in_RSI,3);
  *in_RDI = *in_RDI - aVar1;
  aVar1 = cdf_element_prob(in_RSI,4);
  *in_RDI = *in_RDI - aVar1;
  aVar1 = cdf_element_prob(in_RSI,6);
  *in_RDI = *in_RDI - aVar1;
  aVar1 = cdf_element_prob(in_RSI,7);
  *in_RDI = *in_RDI - aVar1;
  if (in_DL != '\x0f') {
    aVar1 = cdf_element_prob(in_RSI,9);
    *in_RDI = *in_RDI - aVar1;
  }
  *in_RDI = -0x8000 - *in_RDI;
  in_RDI[1] = 0;
  return;
}

Assistant:

static inline void partition_gather_vert_alike(aom_cdf_prob *out,
                                               const aom_cdf_prob *const in,
                                               BLOCK_SIZE bsize) {
  (void)bsize;
  out[0] = CDF_PROB_TOP;
  out[0] -= cdf_element_prob(in, PARTITION_VERT);
  out[0] -= cdf_element_prob(in, PARTITION_SPLIT);
  out[0] -= cdf_element_prob(in, PARTITION_HORZ_A);
  out[0] -= cdf_element_prob(in, PARTITION_VERT_A);
  out[0] -= cdf_element_prob(in, PARTITION_VERT_B);
  if (bsize != BLOCK_128X128) out[0] -= cdf_element_prob(in, PARTITION_VERT_4);
  out[0] = AOM_ICDF(out[0]);
  out[1] = AOM_ICDF(CDF_PROB_TOP);
}